

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O1

void __thiscall
CP::priority_queue<int,_std::less<int>_>::push
          (priority_queue<int,_std::less<int>_> *this,int *element)

{
  int iVar1;
  int *piVar2;
  int tmp;
  ulong uVar3;
  ulong uVar4;
  
  if (this->mCap < this->mSize + 1) {
    expand(this,this->mCap * 2);
  }
  iVar1 = *element;
  piVar2 = this->mData;
  uVar3 = this->mSize;
  piVar2[uVar3] = iVar1;
  this->mSize = uVar3 + 1;
  while (uVar3 != 0) {
    uVar4 = uVar3 - 1 >> 1;
    if (iVar1 < piVar2[uVar4]) goto LAB_00101460;
    piVar2[uVar3] = piVar2[uVar4];
    uVar3 = uVar4;
  }
  uVar3 = 0;
LAB_00101460:
  piVar2[uVar3] = iVar1;
  return;
}

Assistant:

void push(const T& element) {
      if (mSize + 1 > mCap)
        expand(mCap * 2);
      mData[mSize] = element;
      mSize++;
      fixUp(mSize-1);
    }